

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mustache.cpp
# Opt level: O0

void __thiscall TestMustache::testSectionQString(TestMustache *this)

{
  QVariant *this_00;
  QString local_a8;
  QString local_90;
  undefined1 local_78 [8];
  QString output;
  QVariant local_38;
  QHash<QString,_QVariant> local_18;
  QVariantHash data;
  TestMustache *this_local;
  
  data.d = (Data *)this;
  QHash<QString,_QVariant>::QHash(&local_18);
  ::QVariant::QVariant(&local_38,"test");
  QString::QString((QString *)&output.d.size,"text");
  this_00 = QHash<QString,_QVariant>::operator[](&local_18,(QString *)&output.d.size);
  ::QVariant::operator=(this_00,&local_38);
  QString::~QString((QString *)&output.d.size);
  ::QVariant::~QVariant(&local_38);
  QString::QString(&local_90,"{{#text}}{{text}}{{/text}}");
  Mustache::renderTemplate((QString *)local_78,&local_90,&local_18);
  QString::~QString(&local_90);
  QString::QString(&local_a8,"test");
  QTest::qCompare((QString *)local_78,&local_a8,"output","QString(\"test\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/robertknight[P]qt-mustache/tests/test_mustache.cpp"
                  ,0x7f);
  QString::~QString(&local_a8);
  QString::~QString((QString *)local_78);
  QHash<QString,_QVariant>::~QHash(&local_18);
  return;
}

Assistant:

void TestMustache::testSectionQString()
{
	QVariantHash data;
	data["text"] = "test";
	QString output = Mustache::renderTemplate("{{#text}}{{text}}{{/text}}", data);
	QCOMPARE(output, QString("test"));
}